

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::copyValueFrom
          (TypedAttribute<Imath_3_2::Matrix33<float>_> *this,Attribute *other)

{
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar1;
  
  pTVar1 = cast(other);
  Imath_3_2::Matrix33<float>::operator=(&this->_value,&pTVar1->_value);
  return;
}

Assistant:

void
TypedAttribute<T>::copyValueFrom (const Attribute& other)
{
    _value = cast (other)._value;
}